

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O2

void __thiscall Population::Population(Population *this,unsigned_long size)

{
  bool bVar1;
  Chromosome chrom;
  Chromosome CStack_78;
  
  (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (bVar1 = size != 0, size = size - 1, bVar1) {
    Chromosome::Chromosome(&CStack_78);
    Chromosome::createRandomTurnList(&CStack_78);
    Chromosome::process(&CStack_78);
    Chromosome::setId(&CStack_78);
    std::vector<Chromosome,_std::allocator<Chromosome>_>::emplace_back<Chromosome>
              (&this->chromosomes,&CStack_78);
    Chromosome::~Chromosome(&CStack_78);
  }
  return;
}

Assistant:

Population(unsigned long size) {

        for (int i = 0; i < size; i++){
            Chromosome chrom;
            chrom.createRandomTurnList();
            chrom.process();
            chrom.setId();
            chromosomes.push_back(std::move(chrom));
        }
    }